

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O1

void makeContextCurrentOSMesa(_GLFWwindow *window)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int height;
  int width;
  int local_20;
  int local_1c;
  
  if (window != (_GLFWwindow *)0x0) {
    _glfwPlatformGetFramebufferSize(window,&local_1c,&local_20);
    pvVar3 = (window->context).osmesa.buffer;
    if (((pvVar3 == (void *)0x0) || (local_1c != (window->context).osmesa.width)) ||
       (local_20 != (window->context).osmesa.height)) {
      free(pvVar3);
      iVar1 = local_1c;
      iVar2 = local_20;
      pvVar3 = calloc(4,(long)(local_20 * local_1c));
      (window->context).osmesa.buffer = pvVar3;
      (window->context).osmesa.width = iVar1;
      (window->context).osmesa.height = iVar2;
    }
    iVar2 = (*_glfw.osmesa.MakeCurrent)
                      ((window->context).osmesa.handle,(window->context).osmesa.buffer,0x1401,
                       local_1c,local_20);
    if (iVar2 == 0) {
      _glfwInputError(0x10008,"OSMesa: Failed to make context current");
      return;
    }
  }
  _glfwPlatformSetTls(&_glfw.contextSlot,window);
  return;
}

Assistant:

static void makeContextCurrentOSMesa(_GLFWwindow* window)
{
    if (window)
    {
        int width, height;
        _glfwPlatformGetFramebufferSize(window, &width, &height);

        // Check to see if we need to allocate a new buffer
        if ((window->context.osmesa.buffer == NULL) ||
            (width != window->context.osmesa.width) ||
            (height != window->context.osmesa.height))
        {
            free(window->context.osmesa.buffer);

            // Allocate the new buffer (width * height * 8-bit RGBA)
            window->context.osmesa.buffer = calloc(4, width * height);
            window->context.osmesa.width  = width;
            window->context.osmesa.height = height;
        }

        if (!OSMesaMakeCurrent(window->context.osmesa.handle,
                               window->context.osmesa.buffer,
                               GL_UNSIGNED_BYTE,
                               width, height))
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "OSMesa: Failed to make context current");
            return;
        }
    }

    _glfwPlatformSetTls(&_glfw.contextSlot, window);
}